

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

ParseNodePtr __thiscall ParseNode::GetFormalNext(ParseNode *this)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeParamPattern *pPVar3;
  undefined4 *puVar4;
  ParseNodeVar *pPVar5;
  ParseNodePtr local_18;
  ParseNodePtr pnodeNext;
  ParseNode *this_local;
  
  if (this->nop == knopParamPattern) {
    pPVar3 = AsParseNodeParamPattern(this);
    local_18 = pPVar3->pnodeNext;
  }
  else {
    bVar2 = IsVarLetOrConst(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/ptree.cpp"
                         ,0x11f,"(IsVarLetOrConst())","IsVarLetOrConst()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pPVar5 = AsParseNodeVar(this);
    local_18 = pPVar5->pnodeNext;
  }
  return local_18;
}

Assistant:

ParseNodePtr ParseNode::GetFormalNext()
{
    ParseNodePtr pnodeNext = nullptr;

    if (nop == knopParamPattern)
    {
        pnodeNext = this->AsParseNodeParamPattern()->pnodeNext;
    }
    else
    {
        Assert(IsVarLetOrConst());
        pnodeNext = this->AsParseNodeVar()->pnodeNext;
    }
    return pnodeNext;
}